

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmappedfilebuffer.cpp
# Opt level: O3

void __thiscall QMappedFileBuffer::remap(QMappedFileBuffer *this)

{
  long *plVar1;
  undefined8 uVar2;
  uchar *puVar3;
  
  plVar1 = (long *)QMetaObject::cast((QObject *)&QFile::staticMetaObject);
  if (plVar1 != (long *)0x0) {
    if (this->m_mappeddata != (uchar *)0x0) {
      QFileDevice::unmap((uchar *)plVar1);
    }
    uVar2 = (**(code **)(*plVar1 + 0x80))(plVar1);
    puVar3 = (uchar *)QFileDevice::map(plVar1,0,uVar2,0);
    this->m_mappeddata = puVar3;
  }
  return;
}

Assistant:

void QMappedFileBuffer::remap() {
    QFile* f = qobject_cast<QFile*>(m_device);
    if(!f)
        return;

    if(m_mappeddata)
        f->unmap(m_mappeddata);
    m_mappeddata = f->map(0, f->size());
}